

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_zlib_header(stbi__zbuf *a)

{
  byte bVar1;
  byte bVar2;
  int flg;
  int cm;
  int cmf;
  stbi__zbuf *a_local;
  
  bVar1 = stbi__zget8(a);
  bVar2 = stbi__zget8(a);
  if (((uint)bVar1 * 0x100 + (uint)bVar2) % 0x1f == 0) {
    if ((bVar2 & 0x20) == 0) {
      if ((bVar1 & 0xf) == 8) {
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = stbi__err("Corrupt PNG");
      }
    }
    else {
      a_local._4_4_ = stbi__err("Corrupt PNG");
    }
  }
  else {
    a_local._4_4_ = stbi__err("Corrupt PNG");
  }
  return a_local._4_4_;
}

Assistant:

static int stbi__parse_zlib_header(stbi__zbuf *a)
{
   int cmf   = stbi__zget8(a);
   int cm    = cmf & 15;
   /* int cinfo = cmf >> 4; */
   int flg   = stbi__zget8(a);
   if ((cmf*256+flg) % 31 != 0) return stbi__err("bad zlib header","Corrupt PNG"); // zlib spec
   if (flg & 32) return stbi__err("no preset dict","Corrupt PNG"); // preset dictionary not allowed in png
   if (cm != 8) return stbi__err("bad compression","Corrupt PNG"); // DEFLATE required for png
   // window = 1 << (8 + cinfo)... but who cares, we fully buffer output
   return 1;
}